

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O1

void MapOptHandler_sky2(FMapInfoParser *parse,level_info_t *info)

{
  bool bVar1;
  
  if (parse->format_type == 2) {
    FScanner::MustGetStringName(&parse->sc,"=");
  }
  FScanner::MustGetString(&parse->sc);
  FString::operator=(&info->SkyPic2,(parse->sc).String);
  bVar1 = FMapInfoParser::CheckFloat(parse);
  if (bVar1) {
    if (parse->HexenHack == true) {
      (parse->sc).Float = (parse->sc).Float * 0.00390625;
    }
    info->skyspeed2 = (float)((parse->sc).Float * 0.035);
  }
  return;
}

Assistant:

DEFINE_MAP_OPTION(sky2, true)
{
	parse.ParseAssign();
	parse.ParseLumpOrTextureName(info->SkyPic2);
	if (parse.CheckFloat())
	{
		if (parse.HexenHack)
		{
			parse.sc.Float /= 256;
		}
		info->skyspeed2 = float(parse.sc.Float * (35. / 1000.));
	}
}